

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

void __thiscall
flatbuffers::ts::TsGenerator::GenEnum
          (TsGenerator *this,EnumDef *enum_def,string *code_ptr,import_set *imports,bool reverse)

{
  IdlNamer *pIVar1;
  BaseType BVar2;
  EnumVal *pEVar3;
  EnumDef *enum_def_00;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  undefined8 __x;
  char *__rhs;
  anon_class_40_5_fa253b3e *this_00;
  pointer ppEVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string enum_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> valid_union_type_with_null;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string valid_union_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  anon_class_40_5_fa253b3e union_enum_loop;
  
  if (!reverse && (enum_def->super_Definition).generated == false) {
    GenDocComment(&(enum_def->super_Definition).doc_comment,code_ptr,(char *)0x0);
    std::__cxx11::string::append((char *)code_ptr);
    pIVar1 = &this->namer_;
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&union_enum_loop,pIVar1,enum_def);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&union_enum_loop);
    std::__cxx11::string::append((char *)code_ptr);
    for (ppEVar5 = (enum_def->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar5 !=
        (enum_def->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar5 = ppEVar5 + 1) {
      pEVar3 = *ppEVar5;
      if ((pEVar3->doc_comment).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pEVar3->doc_comment).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (ppEVar5 !=
            (enum_def->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::push_back((char)code_ptr);
        }
        GenDocComment(&pEVar3->doc_comment,code_ptr,"  ");
      }
      (*(pIVar1->super_Namer)._vptr_Namer[0x13])(&valid_union_type_with_null,pIVar1,pEVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &union_enum_loop,"  ",&valid_union_type_with_null);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&union_enum_loop);
      std::__cxx11::string::~string((string *)&valid_union_type_with_null);
      std::__cxx11::string::append((char *)code_ptr);
      if ((enum_def->underlying_type).base_type - BASE_TYPE_LONG < 2) {
        EnumDef::ToString_abi_cxx11_(&enum_type,enum_def,pEVar3);
        std::operator+(&valid_union_type_with_null,"\'",&enum_type);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &union_enum_loop,&valid_union_type_with_null,"\'");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&union_enum_loop);
        std::__cxx11::string::~string((string *)&valid_union_type_with_null);
        this_00 = (anon_class_40_5_fa253b3e *)&enum_type;
      }
      else {
        EnumDef::ToString_abi_cxx11_((string *)&union_enum_loop,enum_def,pEVar3);
        std::__cxx11::string::append((string *)code_ptr);
        this_00 = &union_enum_loop;
      }
      std::__cxx11::string::~string((string *)this_00);
      std::__cxx11::string::append((char *)code_ptr);
    }
    std::__cxx11::string::append((char *)code_ptr);
    if (enum_def->is_union != false) {
      enum_def_00 = (enum_def->underlying_type).enum_def;
      if (enum_def_00 == (EnumDef *)0x0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_ts.cpp"
                      ,0x412,
                      "std::string flatbuffers::ts::TsGenerator::GenUnionConvFunc(const Type &, import_set &)"
                     );
      }
      valid_union_type._M_dataplus._M_p = (pointer)&valid_union_type.field_2;
      valid_union_type._M_string_length = 0;
      valid_union_type_with_null.field_2._8_8_ = &valid_union_type_with_null._M_string_length;
      valid_union_type_with_null._M_string_length._0_4_ = 0;
      valid_union_type_with_null.field_2._M_allocated_capacity = 0;
      valid_union_type.field_2._M_local_buf[0] = '\0';
      for (ppEVar5 = (enum_def_00->vals).vec.
                     super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppEVar5 !=
          (enum_def_00->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppEVar5 = ppEVar5 + 1) {
        pEVar3 = *ppEVar5;
        if (pEVar3->value != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&enum_type,"",(allocator<char> *)&union_enum_loop);
          BVar2 = (pEVar3->union_type).base_type;
          if (BVar2 == BASE_TYPE_STRUCT) {
            AddImport<flatbuffers::StructDef>
                      ((ImportDefinition *)&union_enum_loop,this,imports,
                       &enum_def_00->super_Definition,(pEVar3->union_type).struct_def);
            std::__cxx11::string::operator=((string *)&enum_type,(string *)&union_enum_loop);
            anon_unknown_10::ImportDefinition::~ImportDefinition
                      ((ImportDefinition *)&union_enum_loop);
          }
          else {
            if (BVar2 != BASE_TYPE_STRING) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_ts.cpp"
                            ,0x328,
                            "std::string flatbuffers::ts::TsGenerator::GenUnionTypeTS(const EnumDef &, import_set &)"
                           );
            }
            std::__cxx11::string::assign((char *)&enum_type);
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&valid_union_type_with_null,&enum_type);
          std::__cxx11::string::~string((string *)&enum_type);
        }
      }
      for (__x = valid_union_type_with_null.field_2._8_8_;
          (size_type *)__x != &valid_union_type_with_null._M_string_length;
          __x = std::_Rb_tree_increment((_Rb_tree_node_base *)__x)) {
        _Var4 = std::next<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                          ((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )__x,1);
        __rhs = "|";
        if (_Var4._M_node == (_Base_ptr)&valid_union_type_with_null._M_string_length) {
          __rhs = "";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &union_enum_loop,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (__x + 0x20),__rhs);
        std::__cxx11::string::append((string *)&valid_union_type);
        std::__cxx11::string::~string((string *)&union_enum_loop);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&valid_union_type_with_null);
      std::operator+(&valid_union_type_with_null,&valid_union_type,"|null");
      GenUnionConvFuncName_abi_cxx11_(&local_240,this,enum_def_00);
      std::operator+(&local_220,"\n\nexport function ",&local_240);
      std::operator+(&local_200,&local_220,"(\n  type: ");
      (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_260,pIVar1,enum_def_00);
      std::operator+(&local_1e0,&local_200,&local_260);
      std::operator+(&local_1c0,&local_1e0,",\n  accessor: (obj:");
      std::operator+(&local_1a0,&local_1c0,&valid_union_type);
      std::operator+(&local_2a0,&local_1a0,") => ");
      std::operator+(&local_310,&local_2a0,&valid_union_type_with_null);
      std::operator+(&enum_type,&local_310,"\n): ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &union_enum_loop,&enum_type,&valid_union_type_with_null);
      std::operator+(&local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &union_enum_loop," {\n");
      std::__cxx11::string::~string((string *)&union_enum_loop);
      std::__cxx11::string::~string((string *)&enum_type);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      AddImport<flatbuffers::EnumDef>
                ((ImportDefinition *)&union_enum_loop,this,imports,&enum_def_00->super_Definition,
                 enum_def_00);
      enum_type._M_dataplus._M_p = (pointer)&enum_type.field_2;
      if (union_enum_loop.ret ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &union_enum_loop.enum_def) {
        enum_type.field_2._8_8_ = union_enum_loop.this;
      }
      else {
        enum_type._M_dataplus._M_p = (pointer)union_enum_loop.ret;
      }
      enum_type._M_string_length = (size_type)union_enum_loop.enum_type;
      union_enum_loop.enum_type = (string *)0x0;
      union_enum_loop.enum_def = (EnumDef *)((ulong)union_enum_loop.enum_def & 0xffffffffffffff00);
      union_enum_loop.ret =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &union_enum_loop.enum_def;
      anon_unknown_10::ImportDefinition::~ImportDefinition((ImportDefinition *)&union_enum_loop);
      union_enum_loop.ret = &local_280;
      union_enum_loop.enum_type = &enum_type;
      union_enum_loop.enum_def = enum_def_00;
      union_enum_loop.this = this;
      union_enum_loop.imports = imports;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"accessor(",(allocator<char> *)&local_2a0);
      GenUnionConvFunc::anon_class_40_5_fa253b3e::operator()(&union_enum_loop,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::append((char *)&local_280);
      GenUnionListConvFuncName_abi_cxx11_(&local_140,this,enum_def_00);
      std::operator+(&local_120,"\n\nexport function ",&local_140);
      std::operator+(&local_260,&local_120,"(\n  type: ");
      (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_160,pIVar1,enum_def_00);
      std::operator+(&local_240,&local_260,&local_160);
      std::operator+(&local_220,&local_240,", \n  accessor: (index: number, obj:");
      std::operator+(&local_200,&local_220,&valid_union_type);
      std::operator+(&local_1e0,&local_200,") => ");
      std::operator+(&local_1c0,&local_1e0,&valid_union_type_with_null);
      std::operator+(&local_1a0,&local_1c0,", \n  index: number\n): ");
      std::operator+(&local_2a0,&local_1a0,&valid_union_type_with_null);
      std::operator+(&local_310,&local_2a0," {\n");
      std::__cxx11::string::append((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"accessor(index, ",(allocator<char> *)&local_2a0);
      GenUnionConvFunc::anon_class_40_5_fa253b3e::operator()(&union_enum_loop,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::append((char *)&local_280);
      std::__cxx11::string::~string((string *)&enum_type);
      std::__cxx11::string::~string((string *)&valid_union_type_with_null);
      std::__cxx11::string::~string((string *)&valid_union_type);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_280);
    }
    std::__cxx11::string::append((char *)code_ptr);
  }
  return;
}

Assistant:

void GenEnum(EnumDef &enum_def, std::string *code_ptr, import_set &imports,
               bool reverse) {
    if (enum_def.generated) return;
    if (reverse) return;  // FIXME.
    std::string &code = *code_ptr;
    GenDocComment(enum_def.doc_comment, code_ptr);
    code += "export enum ";
    code += GetTypeName(enum_def);
    code += " {\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      if (!ev.doc_comment.empty()) {
        if (it != enum_def.Vals().begin()) { code += '\n'; }
        GenDocComment(ev.doc_comment, code_ptr, "  ");
      }

      // Generate mapping between EnumName: EnumValue(int)
      if (reverse) {
        code += "  '" + enum_def.ToString(ev) + "'";
        code += " = ";
        code += "'" + namer_.Variant(ev) + "'";
      } else {
        code += "  " + namer_.Variant(ev);
        code += " = ";
        // Unfortunately, because typescript does not support bigint enums,
        // for 64-bit enums, we instead map the enum names to strings.
        switch (enum_def.underlying_type.base_type) {
          case BASE_TYPE_LONG:
          case BASE_TYPE_ULONG: {
            code += "'" + enum_def.ToString(ev) + "'";
            break;
          }
          default: code += enum_def.ToString(ev);
        }
      }

      code += (it + 1) != enum_def.Vals().end() ? ",\n" : "\n";
    }
    code += "}";

    if (enum_def.is_union) {
      code += GenUnionConvFunc(enum_def.underlying_type, imports);
    }

    code += "\n";
  }